

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseXor_uvec2(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  
  fVar3 = c->in[1].m_data[1];
  fVar4 = c->in[1].m_data[3];
  uVar2 = *(undefined8 *)(c->in[0].m_data + 3);
  fVar7 = (float)uVar2;
  fVar8 = (float)((ulong)uVar2 >> 0x20);
  fVar1 = c->in[0].m_data[1];
  auVar5._0_4_ = (int)fVar3;
  auVar5._4_4_ = (int)fVar1;
  auVar5._8_4_ = (int)fVar4;
  auVar10._0_4_ = auVar5._0_4_ >> 0x1f;
  auVar10._4_4_ = auVar5._4_4_ >> 0x1f;
  auVar10._8_4_ = auVar5._8_4_ >> 0x1f;
  auVar9._0_4_ = (int)(fVar3 - 2.1474836e+09);
  auVar9._4_4_ = (int)(fVar1 - 2.1474836e+09);
  auVar9._8_4_ = (int)(fVar4 - 2.1474836e+09);
  auVar6._0_4_ = (int)fVar7;
  auVar6._4_4_ = (int)fVar8;
  auVar6._8_4_ = 0;
  auVar11._0_4_ = auVar6._0_4_ >> 0x1f;
  auVar11._4_4_ = auVar6._4_4_ >> 0x1f;
  auVar11._8_4_ = 0;
  auVar12._4_4_ = (int)(fVar8 - 2.1474836e+09);
  auVar12._0_4_ = (int)(fVar7 - 2.1474836e+09);
  auVar12._8_4_ = 0x80000000;
  auVar12 = (auVar11 & auVar12 | auVar6) ^ (auVar9 & auVar10 | auVar5);
  auVar13._0_8_ = auVar12._0_8_ & 0xffffffff;
  auVar13._8_4_ = auVar12._4_4_;
  auVar13._12_4_ = 0;
  *(ulong *)((c->color).m_data + 1) =
       CONCAT44((float)(SUB168(auVar13 | _DAT_01a91940,8) - DAT_01a91940._8_8_),
                (float)(SUB168(auVar13 | _DAT_01a91940,0) - (double)DAT_01a91940));
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }